

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall CClient::ProcessServerPacket(CClient *this,CNetChunk *pPacket)

{
  int iVar1;
  int iVar2;
  void *pData_00;
  long *plVar3;
  code *pcVar4;
  _func_int *p_Var5;
  _func_int **pp_Var6;
  undefined8 *puVar7;
  CClient *this_00;
  undefined1 *puVar8;
  bool bVar9;
  int iVar10;
  char *pcVar11;
  uchar *puVar12;
  ulong uVar13;
  IStorage *pIVar14;
  undefined4 extraout_var;
  CConfig *pCVar15;
  IGameClient *pIVar16;
  int64 iVar17;
  CData *pCVar18;
  long lVar19;
  undefined1 *puVar20;
  long in_FS_OFFSET;
  int64 TimeLeft_1;
  int64 TickStart;
  int64 Now;
  int IntSize;
  void *pDeltaData;
  int DeltashotSize;
  int SnapSize;
  CSnapshot *pTmpBuffer3;
  int DeltaSize;
  int PurgeTick;
  char *pData_1;
  int CompleteSize;
  int Crc;
  int PartSize;
  int DeltaTick;
  int GameTick;
  int Part;
  int NumParts;
  int k;
  int64 Target;
  int TimeLeft;
  int InputPredTick;
  char *pLine;
  char *pName_3;
  char *pName_2;
  char *pName_1;
  char *pParams;
  char *pHelp;
  char *pName;
  char *pError_1;
  uchar *pData;
  int Size;
  int i;
  char *pError;
  SHA256_DIGEST *pMapSha256;
  int MapChunkSize;
  int MapChunkNum;
  int MapSize;
  int MapCrc;
  char *pMap;
  int Sys;
  int Msg;
  CNetChunk *pPacket_local;
  CClient *this_local;
  CSnapshot *pDeltaShot;
  CUnpacker Unpacker;
  char aBuf_4 [256];
  char aBuf_3 [64];
  char aBuf_2 [256];
  uchar aTmpBuffer3 [65536];
  uchar aTmpBuffer2 [65536];
  char aBuf_1 [256];
  CMsgPacker Msg_3;
  CServerInfo Info;
  CMsgPacker Msg_2;
  CMsgPacker Msg_1;
  char aBuf [256];
  
  puVar8 = (undefined1 *)register0x00000020;
  do {
    puVar20 = puVar8;
    *(undefined8 *)(puVar20 + -0x1000) = 0;
    puVar8 = puVar20 + -0x1000;
  } while ((int *)(puVar20 + -0x1000) != &GameTick);
  *(undefined8 *)(puVar20 + 0x22ff8) = *(undefined8 *)(in_FS_OFFSET + 0x28);
  *(CClient **)(puVar20 + -0xf58) = this;
  *(CNetChunk **)(puVar20 + -0xf60) = pPacket;
  *(undefined8 *)(puVar20 + -0x1060) = *(undefined8 *)(puVar20 + -0xf58);
  pData_00 = *(void **)(*(long *)(puVar20 + -0xf60) + 0x28);
  iVar10 = *(int *)(*(long *)(puVar20 + -0xf60) + 0x20);
  *(undefined8 *)(puVar20 + -0x1140) = 0x12306e;
  CUnpacker::Reset((CUnpacker *)(puVar20 + -0xf48),pData_00,iVar10);
  *(undefined8 *)(puVar20 + -0x1140) = 0x12307b;
  iVar10 = CUnpacker::GetInt(*(CUnpacker **)(puVar20 + -0x1130));
  *(int *)(puVar20 + -0xf64) = iVar10;
  *(uint *)(puVar20 + -0xf68) = *(uint *)(puVar20 + -0xf64) & 1;
  *(int *)(puVar20 + -0xf64) = *(int *)(puVar20 + -0xf64) >> 1;
  *(undefined8 *)(puVar20 + -0x1140) = 0x1230b0;
  bVar9 = CUnpacker::Error((CUnpacker *)(puVar20 + -0xf48));
  if (!bVar9) {
    if (*(int *)(puVar20 + -0xf68) == 0) {
      if ((*(uint *)(*(long *)(puVar20 + -0xf60) + 0x1c) & 1) != 0) {
        *(undefined8 *)(puVar20 + -0x1140) = 0x124a8a;
        pIVar16 = GameClient(*(CClient **)(puVar20 + -0x1060));
        p_Var5 = (pIVar16->super_IInterface)._vptr_IInterface[0xd];
        *(undefined8 *)(puVar20 + -0x1140) = 0x124aa2;
        (*p_Var5)(pIVar16,(ulong)*(uint *)(puVar20 + -0xf64),puVar20 + -0xf48);
        if ((*(byte *)(*(long *)(puVar20 + -0x1060) + 0x5921d) & 1) != 0) {
          *(undefined8 *)(puVar20 + -0x1140) = 0x124ac7;
          bVar9 = CDemoRecorder::IsRecording
                            ((CDemoRecorder *)(*(long *)(puVar20 + -0x1060) + 0x30430));
          if (bVar9) {
            *(undefined8 *)(puVar20 + -0x1140) = 0x124af8;
            CDemoRecorder::RecordMessage
                      (*(CDemoRecorder **)(puVar20 + -0x1130),*(void **)(puVar20 + -0x1138),
                       *(int *)(puVar20 + -0x113c));
          }
        }
      }
    }
    else if (((*(uint *)(*(long *)(puVar20 + -0xf60) + 0x1c) & 1) == 0) ||
            (*(int *)(puVar20 + -0xf64) != 2)) {
      if (((*(uint *)(*(long *)(puVar20 + -0xf60) + 0x1c) & 1) == 0) ||
         (*(int *)(puVar20 + -0xf64) != 3)) {
        if (((*(uint *)(*(long *)(puVar20 + -0xf60) + 0x1c) & 1) == 0) ||
           (*(int *)(puVar20 + -0xf64) != 4)) {
          if (((*(uint *)(*(long *)(puVar20 + -0xf60) + 0x1c) & 1) == 0) ||
             (*(int *)(puVar20 + -0xf64) != 5)) {
            if (*(int *)(puVar20 + -0xf64) == 0x1a) {
              *(undefined8 *)(puVar20 + -0x1140) = 0x123a7f;
              CMsgPacker::CMsgPacker
                        (*(CMsgPacker **)(puVar20 + -0x1130),*(int *)(puVar20 + -0x1134),
                         (bool)puVar20[-0x1135]);
              pcVar4 = *(code **)(**(long **)(puVar20 + -0x1060) + 0x120);
              *(undefined8 *)(puVar20 + -0x1140) = 0x123a9a;
              (*pcVar4)(*(long **)(puVar20 + -0x1060),puVar20 + 0x1f420,0);
            }
            else if (((*(uint *)(*(long *)(puVar20 + -0xf60) + 0x1c) & 1) == 0) ||
                    (*(int *)(puVar20 + -0xf64) != 0xe)) {
              if (((*(uint *)(*(long *)(puVar20 + -0xf60) + 0x1c) & 1) == 0) ||
                 (*(int *)(puVar20 + -0xf64) != 0xf)) {
                if (((*(uint *)(*(long *)(puVar20 + -0xf60) + 0x1c) & 1) == 0) ||
                   (*(int *)(puVar20 + -0xf64) != 0x1d)) {
                  if (((*(uint *)(*(long *)(puVar20 + -0xf60) + 0x1c) & 1) == 0) ||
                     (*(int *)(puVar20 + -0xf64) != 0x1e)) {
                    if (((*(uint *)(*(long *)(puVar20 + -0xf60) + 0x1c) & 1) == 0) ||
                       (*(int *)(puVar20 + -0xf64) != 0xb)) {
                      if (((*(uint *)(*(long *)(puVar20 + -0xf60) + 0x1c) & 1) == 0) ||
                         (*(int *)(puVar20 + -0xf64) != 0xc)) {
                        if (((*(uint *)(*(long *)(puVar20 + -0xf60) + 0x1c) & 1) == 0) ||
                           (*(int *)(puVar20 + -0xf64) != 0xd)) {
                          if (*(int *)(puVar20 + -0xf64) == 0x1b) {
                            *(undefined1 **)(puVar20 + -0x1088) = puVar20 + 0x1f318;
                            *(undefined8 *)(puVar20 + -0x1140) = 0x123df3;
                            iVar17 = time_get();
                            *(float *)(puVar20 + -0x108c) =
                                 (float)((iVar17 - *(long *)(*(long *)(puVar20 + -0x1060) + 0x59240)
                                         ) * 1000);
                            *(undefined8 *)(puVar20 + -0x1140) = 0x123e1c;
                            iVar17 = time_freq();
                            *(undefined8 *)(puVar20 + -0x1140) = 0x123e4d;
                            str_format((char *)(double)(*(float *)(puVar20 + -0x108c) /
                                                       (float)iVar17),*(int *)(puVar20 + -0x1088),
                                       (char *)0x100,"latency %.2f");
                            plVar3 = *(long **)(*(long *)(puVar20 + -0x1060) + 0x98);
                            pcVar4 = *(code **)(*plVar3 + 200);
                            *(undefined8 *)(puVar20 + -0x1140) = 0x123e7a;
                            (*pcVar4)(plVar3,0,"client/network",puVar20 + 0x1f318);
                          }
                          else if (*(int *)(puVar20 + -0xf64) == 10) {
                            *(undefined8 *)(puVar20 + -0x1140) = 0x123e9a;
                            iVar10 = CUnpacker::GetInt(*(CUnpacker **)(puVar20 + -0x1130));
                            *(int *)(puVar20 + -0xfe4) = iVar10;
                            *(undefined8 *)(puVar20 + -0x1140) = 0x123eae;
                            iVar10 = CUnpacker::GetInt(*(CUnpacker **)(puVar20 + -0x1130));
                            *(int *)(puVar20 + -0xfe8) = iVar10;
                            *(undefined8 *)(puVar20 + -0xff0) = 0;
                            *(undefined4 *)(puVar20 + -0xff4) = 0;
                            while (*(int *)(puVar20 + -0xff4) < 200) {
                              if (*(int *)(*(long *)(puVar20 + -0x1060) +
                                           (long)*(int *)(puVar20 + -0xff4) * 0x218 + 0x5af38) ==
                                  *(int *)(puVar20 + -0xfe4)) {
                                *(undefined8 *)(puVar20 + -0x10a8) =
                                     *(undefined8 *)
                                      (*(long *)(puVar20 + -0x1060) +
                                       (long)*(int *)(puVar20 + -0xff4) * 0x218 + 0x5af40);
                                *(undefined8 *)(puVar20 + -0x1140) = 0x123f44;
                                iVar17 = time_get();
                                *(long *)(puVar20 + -0xff0) =
                                     *(long *)(puVar20 + -0x10a8) +
                                     (iVar17 - *(long *)(*(long *)(puVar20 + -0x1060) +
                                                         (long)*(int *)(puVar20 + -0xff4) * 0x218 +
                                                        0x5af48));
                                *(undefined8 *)(puVar20 + -0x1098) =
                                     *(undefined8 *)(puVar20 + -0xff0);
                                *(float *)(puVar20 + -0x109c) =
                                     (float)(*(int *)(puVar20 + -0xfe8) + -10) / 1000.0;
                                *(undefined8 *)(puVar20 + -0x1140) = 0x123fba;
                                iVar17 = time_freq();
                                *(long *)(puVar20 + -0xff0) =
                                     *(long *)(puVar20 + -0x1098) -
                                     (long)(*(float *)(puVar20 + -0x109c) * (float)iVar17);
                                break;
                              }
                              *(int *)(puVar20 + -0xff4) = *(int *)(puVar20 + -0xff4) + 1;
                            }
                            if (*(long *)(puVar20 + -0xff0) != 0) {
                              *(undefined8 *)(puVar20 + -0x1140) = 0x12403f;
                              CSmoothTime::Update(*(CSmoothTime **)(puVar20 + -0x1110),
                                                  *(CGraph **)(puVar20 + -0x1118),
                                                  *(int64 *)(puVar20 + -0x1120),
                                                  *(int *)(puVar20 + -0x1124),
                                                  *(int *)(puVar20 + -0x1128));
                            }
                          }
                          else if (((*(int *)(puVar20 + -0xf64) == 6) ||
                                   (*(int *)(puVar20 + -0xf64) == 8)) ||
                                  (*(int *)(puVar20 + -0xf64) == 7)) {
                            *(undefined4 *)(puVar20 + -0xff8) = 1;
                            *(undefined4 *)(puVar20 + -0xffc) = 0;
                            *(undefined8 *)(puVar20 + -0x1140) = 0x124089;
                            iVar10 = CUnpacker::GetInt(*(CUnpacker **)(puVar20 + -0x1130));
                            *(int *)(puVar20 + -0x1000) = iVar10;
                            *(undefined4 *)(puVar20 + -0x10ac) = *(undefined4 *)(puVar20 + -0x1000);
                            *(undefined8 *)(puVar20 + -0x1140) = 0x1240ab;
                            iVar10 = CUnpacker::GetInt(*(CUnpacker **)(puVar20 + -0x1130));
                            *(int *)(puVar20 + -0x1004) = *(int *)(puVar20 + -0x10ac) - iVar10;
                            *(undefined4 *)(puVar20 + -0x1008) = 0;
                            *(undefined4 *)(puVar20 + -0x100c) = 0;
                            *(undefined4 *)(puVar20 + -0x1010) = 0;
                            *(undefined8 *)(puVar20 + -0x1018) = 0;
                            *(undefined8 *)(puVar20 + -0x1140) = 0x1240f7;
                            iVar10 = IClient::State(*(IClient **)(puVar20 + -0x1060));
                            if (1 < iVar10) {
                              if (*(int *)(puVar20 + -0xf64) == 6) {
                                *(undefined8 *)(puVar20 + -0x1140) = 0x124118;
                                iVar10 = CUnpacker::GetInt(*(CUnpacker **)(puVar20 + -0x1130));
                                *(int *)(puVar20 + -0xff8) = iVar10;
                                *(undefined8 *)(puVar20 + -0x1140) = 0x12412c;
                                iVar10 = CUnpacker::GetInt(*(CUnpacker **)(puVar20 + -0x1130));
                                *(int *)(puVar20 + -0xffc) = iVar10;
                              }
                              if (*(int *)(puVar20 + -0xf64) != 7) {
                                *(undefined8 *)(puVar20 + -0x1140) = 0x12414a;
                                iVar10 = CUnpacker::GetInt(*(CUnpacker **)(puVar20 + -0x1130));
                                *(int *)(puVar20 + -0x100c) = iVar10;
                                *(undefined8 *)(puVar20 + -0x1140) = 0x12415e;
                                iVar10 = CUnpacker::GetInt(*(CUnpacker **)(puVar20 + -0x1130));
                                *(int *)(puVar20 + -0x1008) = iVar10;
                              }
                              *(undefined8 *)(puVar20 + -0x1140) = 0x124179;
                              puVar12 = CUnpacker::GetRaw((CUnpacker *)(puVar20 + -0xf48),
                                                          *(int *)(puVar20 + -0x1008));
                              *(uchar **)(puVar20 + -0x1018) = puVar12;
                              *(undefined8 *)(puVar20 + -0x1140) = 0x12418e;
                              bVar9 = CUnpacker::Error((CUnpacker *)(puVar20 + -0xf48));
                              if (((((!bVar9) && (0 < *(int *)(puVar20 + -0xff8))) &&
                                   ((*(int *)(puVar20 + -0xff8) < 0x41 &&
                                    ((-1 < *(int *)(puVar20 + -0xffc) &&
                                     (*(int *)(puVar20 + -0xffc) < *(int *)(puVar20 + -0xff8)))))))
                                  && (-1 < *(int *)(puVar20 + -0x1008))) &&
                                 ((*(int *)(puVar20 + -0x1008) < 0x385 &&
                                  (*(int *)(*(long *)(puVar20 + -0x1060) + 0x59224) <=
                                   *(int *)(puVar20 + -0x1000))))) {
                                if (*(int *)(puVar20 + -0x1000) !=
                                    *(int *)(*(long *)(puVar20 + -0x1060) + 0x59224)) {
                                  lVar19 = *(long *)(puVar20 + -0x1060);
                                  *(undefined4 *)(lVar19 + 0x591c8) = 0;
                                  *(undefined4 *)(lVar19 + 0x59224) =
                                       *(undefined4 *)(puVar20 + -0x1000);
                                }
                                *(undefined8 *)(puVar20 + -0x1140) = 0x124260;
                                mem_copy(*(void **)(puVar20 + -0x1130),*(void **)(puVar20 + -0x1138)
                                         ,*(uint *)(puVar20 + -0x113c));
                                lVar19 = *(long *)(puVar20 + -0x1060);
                                *(uint *)(lVar19 + 0x591c8) =
                                     1 << ((byte)*(undefined4 *)(puVar20 + -0xffc) & 0x1f) |
                                     *(uint *)(lVar19 + 0x591c8);
                                if (*(int *)(lVar19 + 0x591c8) ==
                                    (1 << ((byte)*(undefined4 *)(puVar20 + -0xff8) & 0x1f)) + -1) {
                                  *(CSnapshot **)(puVar20 + -0xf50) =
                                       &ProcessServerPacket::Emptysnap;
                                  *(undefined1 **)(puVar20 + -0x1028) = puVar20 + -0xce8;
                                  *(int *)(puVar20 + -0x1010) =
                                       (*(int *)(puVar20 + -0xff8) + -1) * 900 +
                                       *(int *)(puVar20 + -0x1008);
                                  *(undefined4 *)(*(long *)(puVar20 + -0x1060) + 0x591c8) = 0;
                                  *(undefined8 *)(puVar20 + -0x1140) = 0x124300;
                                  CSnapshot::Clear(&ProcessServerPacket::Emptysnap);
                                  if (-1 < *(int *)(puVar20 + -0x1004)) {
                                    *(undefined8 *)(puVar20 + -0x1140) = 0x124339;
                                    iVar10 = CSnapshotStorage::Get
                                                       ((CSnapshotStorage *)
                                                        (*(long *)(puVar20 + -0x1060) + 0x76838),
                                                        *(int *)(puVar20 + -0x1004),(int64 *)0x0,
                                                        (CSnapshot **)(puVar20 + -0xf50),
                                                        (CSnapshot **)0x0);
                                    *(int *)(puVar20 + -0x1030) = iVar10;
                                    if (*(int *)(puVar20 + -0x1030) < 0) {
                                      *(undefined8 *)(puVar20 + -0x1140) = 0x124357;
                                      pCVar15 = Config(*(CClient **)(puVar20 + -0x1060));
                                      if (pCVar15->m_Debug != 0) {
                                        *(undefined8 *)(puVar20 + -0x1140) = 0x12437b;
                                        str_format(puVar20 + -0xde8,0x100,
                                                   "error, couldn\'t find the delta snapshot");
                                        plVar3 = *(long **)(*(long *)(puVar20 + -0x1060) + 0x98);
                                        pcVar4 = *(code **)(*plVar3 + 200);
                                        *(undefined8 *)(puVar20 + -0x1140) = 0x1243aa;
                                        (*pcVar4)(plVar3,2,"client",puVar20 + -0xde8,0);
                                      }
                                      *(undefined4 *)(*(long *)(puVar20 + -0x1060) + 0x59220) =
                                           0xffffffff;
                                      goto LAB_00124afc;
                                    }
                                  }
                                  *(undefined8 *)(puVar20 + -0x1140) = 0x1243d7;
                                  pCVar18 = CSnapshotDelta::EmptyDelta
                                                      ((CSnapshotDelta *)
                                                       ((long)&PTR__CInput_002978c8 +
                                                       *(long *)(puVar20 + -0x1060)));
                                  *(CData **)(puVar20 + -0x1038) = pCVar18;
                                  *(undefined4 *)(puVar20 + -0x1020) = 0xc;
                                  if (*(int *)(puVar20 + -0x1010) != 0) {
                                    *(undefined8 *)(puVar20 + -0x1140) = 0x12441c;
                                    lVar19 = CVariableInt::Decompress
                                                       (*(void **)(puVar20 + -0x1108),
                                                        *(int *)(puVar20 + -0x110c),
                                                        *(void **)(puVar20 + -0x1118),
                                                        *(int *)(puVar20 + -0x111c));
                                    *(int *)(puVar20 + -0x103c) = (int)lVar19;
                                    if (*(int *)(puVar20 + -0x103c) < 0) goto LAB_00124afc;
                                    *(undefined1 **)(puVar20 + -0x1038) = puVar20 + 0xf318;
                                    *(undefined4 *)(puVar20 + -0x1020) =
                                         *(undefined4 *)(puVar20 + -0x103c);
                                  }
                                  *(undefined8 *)(puVar20 + -0x1140) = 0x124484;
                                  iVar10 = CSnapshotDelta::UnpackDelta
                                                     ((CSnapshotDelta *)
                                                      ((long)&PTR__CInput_002978c8 +
                                                      *(long *)(puVar20 + -0x1060)),
                                                      *(CSnapshot **)(puVar20 + -0xf50),
                                                      *(CSnapshot **)(puVar20 + -0x1028),
                                                      *(void **)(puVar20 + -0x1038),
                                                      *(int *)(puVar20 + -0x1020));
                                  *(int *)(puVar20 + -0x102c) = iVar10;
                                  if (*(int *)(puVar20 + -0x102c) < 0) {
                                    *(undefined8 *)(puVar20 + -0x1140) = 0x1244b7;
                                    str_format(puVar20 + -0xe28,0x40,"delta unpack failed! (%d)",
                                               (ulong)*(uint *)(puVar20 + -0x102c));
                                    plVar3 = *(long **)(*(long *)(puVar20 + -0x1060) + 0x98);
                                    pcVar4 = *(code **)(*plVar3 + 200);
                                    *(undefined8 *)(puVar20 + -0x1140) = 0x1244e6;
                                    (*pcVar4)(plVar3,2,"client",puVar20 + -0xe28,0);
                                  }
                                  else {
                                    if (*(int *)(puVar20 + -0xf64) != 7) {
                                      *(undefined8 *)(puVar20 + -0x1140) = 0x124506;
                                      iVar10 = CSnapshot::Crc(*(CSnapshot **)(puVar20 + -0x1110));
                                      if (iVar10 != *(int *)(puVar20 + -0x100c)) {
                                        *(undefined8 *)(puVar20 + -0x1140) = 0x124520;
                                        pCVar15 = Config(*(CClient **)(puVar20 + -0x1060));
                                        if (pCVar15->m_Debug != 0) {
                                          *(undefined1 **)(puVar20 + -0x10c0) = puVar20 + -0xf28;
                                          *(undefined4 *)(puVar20 + -0x10b8) =
                                               *(undefined4 *)
                                                (*(long *)(puVar20 + -0x1060) + 0x59214);
                                          *(undefined4 *)(puVar20 + -0x10b4) =
                                               *(undefined4 *)(puVar20 + -0x1000);
                                          *(undefined4 *)(puVar20 + -0x10b0) =
                                               *(undefined4 *)(puVar20 + -0x100c);
                                          *(undefined8 *)(puVar20 + -0x1140) = 0x124578;
                                          iVar10 = CSnapshot::Crc(*(CSnapshot **)(puVar20 + -0x1110)
                                                                 );
                                          *(int *)(puVar20 + -0x1138) = iVar10;
                                          *(undefined4 *)(puVar20 + -0x1130) =
                                               *(undefined4 *)(puVar20 + -0x1010);
                                          *(undefined4 *)(puVar20 + -0x1128) =
                                               *(undefined4 *)(puVar20 + -0x1004);
                                          *(undefined8 *)(puVar20 + -0x1140) = 0x1245c6;
                                          str_format(*(char **)(puVar20 + -0x10c0),0x100,
                                                                                                          
                                                  "snapshot crc error #%d - tick=%d wantedcrc=%d gotcrc=%d compressed_size=%d delta_tick=%d"
                                                  ,(ulong)*(uint *)(puVar20 + -0x10b8),
                                                  (ulong)*(uint *)(puVar20 + -0x10b4),
                                                  (ulong)*(uint *)(puVar20 + -0x10b0));
                                          plVar3 = *(long **)(*(long *)(puVar20 + -0x1060) + 0x98);
                                          pcVar4 = *(code **)(*plVar3 + 200);
                                          *(undefined8 *)(puVar20 + -0x1140) = 0x1245f5;
                                          (*pcVar4)(plVar3,2,"client",puVar20 + -0xf28,0);
                                        }
                                        lVar19 = *(long *)(puVar20 + -0x1060);
                                        *(int *)(lVar19 + 0x59214) = *(int *)(lVar19 + 0x59214) + 1;
                                        if (10 < *(int *)(lVar19 + 0x59214)) {
                                          *(undefined4 *)(*(long *)(puVar20 + -0x1060) + 0x59220) =
                                               0xffffffff;
                                          *(undefined8 *)(puVar20 + -0x1140) = 0x12462c;
                                          SendInput(*(CClient **)(puVar20 + -0x1108));
                                          *(undefined4 *)(*(long *)(puVar20 + -0x1060) + 0x59214) =
                                               0;
                                        }
                                        goto LAB_00124afc;
                                      }
                                    }
                                    if (*(int *)(*(long *)(puVar20 + -0x1060) + 0x59214) != 0) {
                                      *(int *)(*(long *)(puVar20 + -0x1060) + 0x59214) =
                                           *(int *)(*(long *)(puVar20 + -0x1060) + 0x59214) + -1;
                                    }
                                    *(undefined4 *)(puVar20 + -0x101c) =
                                         *(undefined4 *)(puVar20 + -0x1004);
                                    if ((*(long *)(*(long *)(puVar20 + -0x1060) + 0x76850) != 0) &&
                                       (*(int *)(*(long *)(*(long *)(puVar20 + -0x1060) + 0x76850) +
                                                0x18) < *(int *)(puVar20 + -0x101c))) {
                                      *(undefined4 *)(puVar20 + -0x101c) =
                                           *(undefined4 *)
                                            (*(long *)(*(long *)(puVar20 + -0x1060) + 0x76850) +
                                            0x18);
                                    }
                                    if ((*(long *)(*(long *)(puVar20 + -0x1060) + 0x76848) != 0) &&
                                       (*(int *)(*(long *)(*(long *)(puVar20 + -0x1060) + 0x76848) +
                                                0x18) < *(int *)(puVar20 + -0x101c))) {
                                      *(undefined4 *)(puVar20 + -0x101c) =
                                           *(undefined4 *)
                                            (*(long *)(*(long *)(puVar20 + -0x1060) + 0x76848) +
                                            0x18);
                                    }
                                    *(undefined8 *)(puVar20 + -0x1140) = 0x124722;
                                    CSnapshotStorage::PurgeUntil
                                              (*(CSnapshotStorage **)(puVar20 + -0x1120),
                                               *(int *)(puVar20 + -0x1124));
                                    *(long *)(puVar20 + -0x10d0) =
                                         *(long *)(puVar20 + -0x1060) + 0x76838;
                                    *(undefined4 *)(puVar20 + -0x10c4) =
                                         *(undefined4 *)(puVar20 + -0x1000);
                                    *(undefined8 *)(puVar20 + -0x1140) = 0x124745;
                                    time_get();
                                    *(undefined8 *)(puVar20 + -0x1140) = 0x12476b;
                                    CSnapshotStorage::Add
                                              (*(CSnapshotStorage **)(puVar20 + -0x1100),
                                               *(int *)(puVar20 + -0x1104),
                                               *(int64 *)(puVar20 + -0x1110),
                                               *(int *)(puVar20 + -0x1114),
                                               *(void **)(puVar20 + -0x1120),(bool)puVar20[-0x1121])
                                    ;
                                    *(undefined8 *)(puVar20 + -0x1140) = 0x12477f;
                                    bVar9 = CDemoRecorder::IsRecording
                                                      ((CDemoRecorder *)
                                                       (*(long *)(puVar20 + -0x1060) + 0x30430));
                                    if (bVar9) {
                                      *(undefined8 *)(puVar20 + -0x1140) = 0x1247a1;
                                      CSnapshotBuilder::Init
                                                (*(CSnapshotBuilder **)(puVar20 + -0x1120),
                                                 *(CSnapshot **)(puVar20 + -0x1128));
                                      *(undefined8 *)(puVar20 + -0x1140) = 0x1247ae;
                                      pIVar16 = GameClient(*(CClient **)(puVar20 + -0x1060));
                                      p_Var5 = (pIVar16->super_IInterface)._vptr_IInterface[6];
                                      *(undefined8 *)(puVar20 + -0x1140) = 0x1247b7;
                                      (*p_Var5)();
                                      *(undefined8 *)(puVar20 + -0x1140) = 0x1247d3;
                                      iVar10 = CSnapshotBuilder::Finish
                                                         ((CSnapshotBuilder *)
                                                          (BYTE_ARRAY_002868b9 +
                                                          *(long *)(puVar20 + -0x1060) + 7),
                                                          *(void **)(puVar20 + -0x1028));
                                      *(int *)(puVar20 + -0x102c) = iVar10;
                                      *(undefined8 *)(puVar20 + -0x1140) = 0x124804;
                                      CDemoRecorder::RecordSnapshot
                                                ((CDemoRecorder *)
                                                 (*(long *)(puVar20 + -0x1060) + 0x30430),
                                                 *(int *)(puVar20 + -0x1000),
                                                 *(void **)(puVar20 + -0x1028),
                                                 *(int *)(puVar20 + -0x102c));
                                    }
                                    lVar19 = *(long *)(puVar20 + -0x1060);
                                    *(int *)(lVar19 + 0x76858) = *(int *)(lVar19 + 0x76858) + 1;
                                    *(undefined4 *)(lVar19 + 0x59224) =
                                         *(undefined4 *)(puVar20 + -0x1000);
                                    if (*(int *)(lVar19 + 0x76858) == 2) {
                                      *(long *)(puVar20 + -0x10f0) =
                                           *(long *)(puVar20 + -0x1060) + 0x5a4f8;
                                      *(long *)(puVar20 + -0x10e8) =
                                           (long)*(int *)(puVar20 + -0x1000);
                                      *(undefined8 *)(puVar20 + -0x1140) = 0x12485a;
                                      time_freq();
                                      *(undefined8 *)(puVar20 + -0x1140) = 0x12487d;
                                      CSmoothTime::Init(*(CSmoothTime **)(puVar20 + -0x1130),
                                                        *(int64 *)(puVar20 + -0x1138));
                                      *(undefined8 *)(puVar20 + -0x1140) = 0x12489e;
                                      CSmoothTime::SetAdjustSpeed
                                                ((CSmoothTime *)
                                                 (*(long *)(puVar20 + -0x1060) + 0x5a4f8),1,1000.0);
                                      *(long *)(puVar20 + -0x10e0) =
                                           *(long *)(puVar20 + -0x1060) + 0x59cb8;
                                      *(long *)(puVar20 + -0x10d8) =
                                           (long)(*(int *)(puVar20 + -0x1000) + -1);
                                      *(undefined8 *)(puVar20 + -0x1140) = 0x1248c7;
                                      time_freq();
                                      *(undefined8 *)(puVar20 + -0x1140) = 0x1248ea;
                                      CSmoothTime::Init(*(CSmoothTime **)(puVar20 + -0x1130),
                                                        *(int64 *)(puVar20 + -0x1138));
                                      lVar19 = *(long *)(puVar20 + -0x1060);
                                      *(undefined8 *)(lVar19 + 0x76850) =
                                           *(undefined8 *)(lVar19 + 0x76838);
                                      *(undefined8 *)(lVar19 + 0x76848) =
                                           *(undefined8 *)(lVar19 + 0x76840);
                                      *(undefined8 *)(puVar20 + -0x1140) = 0x124918;
                                      SetState(*(CClient **)(puVar20 + -0x1128),
                                               *(int *)(puVar20 + -0x112c));
                                    }
                                    if (2 < *(int *)(*(long *)(puVar20 + -0x1060) + 0x76858)) {
                                      *(long *)(puVar20 + -0x1120) =
                                           *(long *)(puVar20 + -0x1060) + 0x59cb8;
                                      *(undefined8 *)(puVar20 + -0x1140) = 0x124945;
                                      time_get();
                                      *(undefined8 *)(puVar20 + -0x1140) = 0x124952;
                                      iVar17 = CSmoothTime::Get(*(CSmoothTime **)(puVar20 + -0x1100)
                                                                ,*(int64 *)(puVar20 + -0x1108));
                                      *(int64 *)(puVar20 + -0x1048) = iVar17;
                                      *(long *)(puVar20 + -0x1118) =
                                           (long)*(int *)(puVar20 + -0x1000);
                                      *(undefined8 *)(puVar20 + -0x1140) = 0x12496c;
                                      iVar17 = time_freq();
                                      *(long *)(puVar20 + -0x1050) =
                                           (*(long *)(puVar20 + -0x1118) * iVar17) / 0x32;
                                      *(long *)(puVar20 + -0x1110) =
                                           (*(long *)(puVar20 + -0x1050) -
                                           *(long *)(puVar20 + -0x1048)) * 1000;
                                      *(undefined8 *)(puVar20 + -0x1140) = 0x1249ab;
                                      iVar17 = time_freq();
                                      *(long *)(puVar20 + -0x1058) =
                                           *(long *)(puVar20 + -0x1110) / iVar17;
                                      *(long *)(puVar20 + -0x1108) =
                                           *(long *)(puVar20 + -0x1060) + 0x59cb8;
                                      *(long *)(puVar20 + -0x1100) =
                                           *(long *)(puVar20 + -0x1060) + 0x75810;
                                      *(long *)(puVar20 + -0x10f8) =
                                           (long)(*(int *)(puVar20 + -0x1000) + -1);
                                      *(undefined8 *)(puVar20 + -0x1140) = 0x1249fb;
                                      time_freq();
                                      *(undefined8 *)(puVar20 + -0x1140) = 0x124a30;
                                      CSmoothTime::Update(*(CSmoothTime **)(puVar20 + -0x1110),
                                                          *(CGraph **)(puVar20 + -0x1118),
                                                          *(int64 *)(puVar20 + -0x1120),
                                                          *(int *)(puVar20 + -0x1124),
                                                          *(int *)(puVar20 + -0x1128));
                                    }
                                    *(undefined4 *)(*(long *)(puVar20 + -0x1060) + 0x59220) =
                                         *(undefined4 *)(puVar20 + -0x1000);
                                  }
                                }
                              }
                            }
                          }
                        }
                        else {
                          *(undefined8 *)(puVar20 + -0x1140) = 0x123d8e;
                          pcVar11 = CUnpacker::GetString
                                              (*(CUnpacker **)(puVar20 + -0x1118),
                                               *(int *)(puVar20 + -0x111c));
                          *(char **)(puVar20 + -0xfe0) = pcVar11;
                          *(undefined8 *)(puVar20 + -0x1140) = 0x123da3;
                          bVar9 = CUnpacker::Error((CUnpacker *)(puVar20 + -0xf48));
                          if (!bVar9) {
                            *(undefined8 *)(puVar20 + -0x1140) = 0x123dba;
                            pIVar16 = GameClient(*(CClient **)(puVar20 + -0x1060));
                            p_Var5 = (pIVar16->super_IInterface)._vptr_IInterface[3];
                            *(undefined8 *)(puVar20 + -0x1140) = 0x123dcb;
                            (*p_Var5)(pIVar16,*(undefined8 *)(puVar20 + -0xfe0));
                          }
                        }
                      }
                      else {
                        lVar19 = *(long *)(puVar20 + -0x1060);
                        *(undefined4 *)(lVar19 + 0x59228) = 0;
                        if (*(int *)(lVar19 + 0x5922c) != 0) {
                          pcVar4 = *(code **)(**(long **)(*(long *)(puVar20 + -0x1060) + 0x98) +
                                             0x58);
                          *(undefined8 *)(puVar20 + -0x1140) = 0x123d3b;
                          (*pcVar4)();
                        }
                        lVar19 = *(long *)(puVar20 + -0x1060);
                        *(undefined4 *)(lVar19 + 0x5922c) = 0;
                        pcVar4 = *(code **)(**(long **)(lVar19 + 0x98) + 0x70);
                        *(undefined8 *)(puVar20 + -0x1140) = 0x123d5a;
                        (*pcVar4)();
                      }
                    }
                    else {
                      lVar19 = *(long *)(puVar20 + -0x1060);
                      *(undefined4 *)(lVar19 + 0x59228) = 1;
                      *(undefined4 *)(lVar19 + 0x5922c) = 1;
                    }
                  }
                  else {
                    *(undefined8 *)(puVar20 + -0x1140) = 0x123c6f;
                    pcVar11 = CUnpacker::GetString
                                        (*(CUnpacker **)(puVar20 + -0x1118),
                                         *(int *)(puVar20 + -0x111c));
                    *(char **)(puVar20 + -0xfd8) = pcVar11;
                    *(undefined8 *)(puVar20 + -0x1140) = 0x123c84;
                    bVar9 = CUnpacker::Error((CUnpacker *)(puVar20 + -0xf48));
                    if (!bVar9) {
                      plVar3 = *(long **)(*(long *)(puVar20 + -0x1060) + 0x98);
                      pcVar4 = *(code **)(*plVar3 + 0x68);
                      *(undefined8 *)(puVar20 + -0x1140) = 0x123cab;
                      (*pcVar4)(plVar3,*(undefined8 *)(puVar20 + -0xfd8));
                    }
                  }
                }
                else {
                  *(undefined8 *)(puVar20 + -0x1140) = 0x123bff;
                  pcVar11 = CUnpacker::GetString
                                      (*(CUnpacker **)(puVar20 + -0x1118),
                                       *(int *)(puVar20 + -0x111c));
                  *(char **)(puVar20 + -0xfd0) = pcVar11;
                  *(undefined8 *)(puVar20 + -0x1140) = 0x123c14;
                  bVar9 = CUnpacker::Error((CUnpacker *)(puVar20 + -0xf48));
                  if (!bVar9) {
                    plVar3 = *(long **)(*(long *)(puVar20 + -0x1060) + 0x98);
                    pcVar4 = *(code **)(*plVar3 + 0x60);
                    *(undefined8 *)(puVar20 + -0x1140) = 0x123c3b;
                    (*pcVar4)(plVar3,*(undefined8 *)(puVar20 + -0xfd0));
                  }
                }
              }
              else {
                *(undefined8 *)(puVar20 + -0x1140) = 0x123b8f;
                pcVar11 = CUnpacker::GetString
                                    (*(CUnpacker **)(puVar20 + -0x1118),*(int *)(puVar20 + -0x111c))
                ;
                *(char **)(puVar20 + -0xfc8) = pcVar11;
                *(undefined8 *)(puVar20 + -0x1140) = 0x123ba4;
                bVar9 = CUnpacker::Error((CUnpacker *)(puVar20 + -0xf48));
                if (!bVar9) {
                  plVar3 = *(long **)(*(long *)(puVar20 + -0x1060) + 0x98);
                  pcVar4 = *(code **)(*plVar3 + 0x50);
                  *(undefined8 *)(puVar20 + -0x1140) = 0x123bcb;
                  (*pcVar4)(plVar3,*(undefined8 *)(puVar20 + -0xfc8));
                }
              }
            }
            else {
              *(undefined8 *)(puVar20 + -0x1140) = 0x123ad6;
              pcVar11 = CUnpacker::GetString
                                  (*(CUnpacker **)(puVar20 + -0x1118),*(int *)(puVar20 + -0x111c));
              *(char **)(puVar20 + -0xfb0) = pcVar11;
              *(undefined8 *)(puVar20 + -0x1140) = 0x123af0;
              pcVar11 = CUnpacker::GetString
                                  (*(CUnpacker **)(puVar20 + -0x1118),*(int *)(puVar20 + -0x111c));
              *(char **)(puVar20 + -0xfb8) = pcVar11;
              *(undefined8 *)(puVar20 + -0x1140) = 0x123b0a;
              pcVar11 = CUnpacker::GetString
                                  (*(CUnpacker **)(puVar20 + -0x1118),*(int *)(puVar20 + -0x111c));
              *(char **)(puVar20 + -0xfc0) = pcVar11;
              *(undefined8 *)(puVar20 + -0x1140) = 0x123b1f;
              bVar9 = CUnpacker::Error((CUnpacker *)(puVar20 + -0xf48));
              if (!bVar9) {
                plVar3 = *(long **)(*(long *)(puVar20 + -0x1060) + 0x98);
                pcVar4 = *(code **)(*plVar3 + 0x48);
                *(undefined8 *)(puVar20 + -0x1140) = 0x123b5b;
                (*pcVar4)(plVar3,*(undefined8 *)(puVar20 + -0xfb0),*(undefined8 *)(puVar20 + -0xfc0)
                          ,4,*(undefined8 *)(puVar20 + -0xfb8));
              }
            }
          }
          else {
            *(undefined8 *)(puVar20 + -0x1140) = 0x123a50;
            pIVar16 = GameClient(*(CClient **)(puVar20 + -0x1060));
            p_Var5 = (pIVar16->super_IInterface)._vptr_IInterface[0xc];
            *(undefined8 *)(puVar20 + -0x1140) = 0x123a59;
            (*p_Var5)();
          }
        }
        else {
          *(undefined8 *)(puVar20 + -0x1140) = 0x123960;
          memset(puVar20 + 0x1fc3c,0,0x228c);
          *(undefined8 *)(puVar20 + -0x1140) = 0x12398a;
          net_addr_str(*(NETADDR **)(puVar20 + -0x10f8),*(char **)(puVar20 + -0x1100),
                       *(int *)(puVar20 + -0x1104),*(int *)(puVar20 + -0x1108));
          *(undefined8 *)(puVar20 + -0x1140) = 0x1239ab;
          iVar10 = UnpackServerInfo(*(CClient **)(puVar20 + -0x10d8),
                                    *(CUnpacker **)(puVar20 + -0x10e0),
                                    *(CServerInfo **)(puVar20 + -0x10e8),
                                    *(int **)(puVar20 + -0x10f0));
          if (iVar10 == 0) {
            *(undefined8 *)(puVar20 + -0x1140) = 0x1239bd;
            bVar9 = CUnpacker::Error((CUnpacker *)(puVar20 + -0xf48));
            if (!bVar9) {
              *(undefined8 *)(puVar20 + -0x1140) = 0x1239ce;
              SortClients(*(CServerInfo **)(puVar20 + -0x1120));
              *(undefined8 *)(puVar20 + -0x1140) = 0x1239ef;
              mem_copy(*(void **)(puVar20 + -0x1130),*(void **)(puVar20 + -0x1138),
                       *(uint *)(puVar20 + -0x113c));
              lVar19 = *(long *)(puVar20 + -0x1060);
              *(undefined8 *)(gs_Chat.m_History.m_aBuffer + lVar19 + 0x2d64) =
                   *(undefined8 *)(lVar19 + 0x591f8);
              *(undefined8 *)(gs_Chat.m_History.m_aBuffer + lVar19 + 0x2d6c) =
                   *(undefined8 *)(lVar19 + 0x59200);
              *(undefined8 *)(gs_Chat.m_History.m_aBuffer + lVar19 + 0x2d74) =
                   *(undefined8 *)(lVar19 + 0x59208);
            }
          }
        }
      }
      else if (*(long *)(*(long *)(puVar20 + -0x1060) + 0x59c70) != 0) {
        lVar19 = *(long *)(puVar20 + -0x1060);
        iVar10 = *(int *)(lVar19 + 0x59c80);
        iVar1 = *(int *)(lVar19 + 0x59cb0);
        iVar2 = *(int *)(lVar19 + 0x59cac);
        *(undefined8 *)(puVar20 + -0x1140) = 0x123637;
        iVar10 = minimum<int>(iVar10,iVar1 - iVar2);
        *(int *)(puVar20 + -0xf98) = iVar10;
        *(undefined8 *)(puVar20 + -0x1140) = 0x123652;
        puVar12 = CUnpacker::GetRaw((CUnpacker *)(puVar20 + -0xf48),*(int *)(puVar20 + -0xf98));
        *(uchar **)(puVar20 + -4000) = puVar12;
        *(undefined8 *)(puVar20 + -0x1140) = 0x123667;
        bVar9 = CUnpacker::Error((CUnpacker *)(puVar20 + -0xf48));
        if (!bVar9) {
          *(undefined8 *)(puVar20 + -0x1140) = 0x123695;
          io_write(*(IOHANDLE *)(puVar20 + -0x1130),*(void **)(puVar20 + -0x1138),
                   *(uint *)(puVar20 + -0x113c));
          lVar19 = *(long *)(puVar20 + -0x1060);
          *(int *)(lVar19 + 0x59c78) = *(int *)(lVar19 + 0x59c78) + 1;
          *(int *)(lVar19 + 0x59cac) = *(int *)(puVar20 + -0xf98) + *(int *)(lVar19 + 0x59cac);
          if (*(int *)(lVar19 + 0x59cac) == *(int *)(lVar19 + 0x59cb0)) {
            plVar3 = *(long **)(*(long *)(puVar20 + -0x1060) + 0x98);
            pcVar4 = *(code **)(*plVar3 + 200);
            *(undefined8 *)(puVar20 + -0x1140) = 0x1236ff;
            (*pcVar4)(plVar3,1,"client/network","download complete, loading map",0);
            if (*(long *)(*(long *)(puVar20 + -0x1060) + 0x59c70) != 0) {
              *(undefined8 *)(puVar20 + -0x1140) = 0x123725;
              io_close(*(IOHANDLE *)(puVar20 + -0x1140));
            }
            this_00 = *(CClient **)(puVar20 + -0x1060);
            this_00->m_MapdownloadFileTemp = (IOHANDLE)0x0;
            this_00->m_MapdownloadAmount = 0;
            this_00->m_MapdownloadTotalsize = -1;
            *(undefined8 *)(puVar20 + -0x1140) = 0x123751;
            pIVar14 = Storage(this_00);
            p_Var5 = (pIVar14->super_IInterface)._vptr_IInterface[9];
            *(undefined8 *)(puVar20 + -0x1140) = 0x12376b;
            (*p_Var5)(pIVar14,*(long *)(puVar20 + -0x1060) + 0x5966c,0);
            *(undefined8 *)(puVar20 + -0x1140) = 0x123778;
            pIVar14 = Storage(*(CClient **)(puVar20 + -0x1060));
            p_Var5 = (pIVar14->super_IInterface)._vptr_IInterface[10];
            *(undefined8 *)(puVar20 + -0x1140) = 0x12379c;
            (*p_Var5)(pIVar14,*(long *)(puVar20 + -0x1060) + 0x5986c,
                      *(long *)(puVar20 + -0x1060) + 0x5966c,0);
            lVar19 = *(long *)(puVar20 + -0x1060);
            *(long *)(puVar20 + -0x1078) = lVar19 + 0x59a6c;
            *(long *)(puVar20 + -0x1070) = lVar19 + 0x5966c;
            if ((*(byte *)(lVar19 + 0x59ca4) & 1) == 0) {
              *(undefined8 *)(puVar20 + -0x1080) = 0;
            }
            else {
              *(long *)(puVar20 + -0x1080) = *(long *)(puVar20 + -0x1060) + 0x59c84;
            }
            *(undefined8 *)(puVar20 + -0x1140) = 0x123821;
            pcVar11 = LoadMap(*(CClient **)(puVar20 + -0x10e0),*(char **)(puVar20 + -0x10e8),
                              *(char **)(puVar20 + -0x10f0),*(SHA256_DIGEST **)(puVar20 + -0x10f8),
                              *(uint *)(puVar20 + -0x10fc));
            *(char **)(puVar20 + -0xfa8) = pcVar11;
            if (*(long *)(puVar20 + -0xfa8) == 0) {
              plVar3 = *(long **)(*(long *)(puVar20 + -0x1060) + 0x98);
              pcVar4 = *(code **)(*plVar3 + 200);
              *(undefined8 *)(puVar20 + -0x1140) = 0x123862;
              (*pcVar4)(plVar3,1,"client/network","loading done",0);
              *(undefined8 *)(puVar20 + -0x1140) = 0x12386f;
              SendReady(*(CClient **)(puVar20 + -0x1130));
            }
            else {
              *(undefined8 *)(puVar20 + -0x1140) = 0x123886;
              DisconnectWithReason(*(CClient **)(puVar20 + -0x1118),*(char **)(puVar20 + -0x1120));
            }
          }
          else if (*(int *)(*(long *)(puVar20 + -0x1060) + 0x59c78) %
                   *(int *)(*(long *)(puVar20 + -0x1060) + 0x59c7c) == 0) {
            *(undefined8 *)(puVar20 + -0x1140) = 0x1238bc;
            CMsgPacker::CMsgPacker
                      (*(CMsgPacker **)(puVar20 + -0x1130),*(int *)(puVar20 + -0x1134),
                       (bool)puVar20[-0x1135]);
            pcVar4 = *(code **)(**(long **)(puVar20 + -0x1060) + 0x120);
            *(undefined8 *)(puVar20 + -0x1140) = 0x1238da;
            (*pcVar4)(*(long **)(puVar20 + -0x1060),puVar20 + 0x21ec8,3);
            *(undefined8 *)(puVar20 + -0x1140) = 0x1238e7;
            pCVar15 = Config(*(CClient **)(puVar20 + -0x1060));
            if (pCVar15->m_Debug != 0) {
              plVar3 = *(long **)(*(long *)(puVar20 + -0x1060) + 0x98);
              pcVar4 = *(code **)(*plVar3 + 200);
              *(undefined8 *)(puVar20 + -0x1140) = 0x12391e;
              (*pcVar4)(plVar3,2,"client/network","requested next chunk package",0);
            }
          }
        }
      }
    }
    else {
      *(undefined8 *)(puVar20 + -0x1140) = 0x123100;
      pcVar11 = CUnpacker::GetString(*(CUnpacker **)(puVar20 + -0x1118),*(int *)(puVar20 + -0x111c))
      ;
      *(char **)(puVar20 + -0xf70) = pcVar11;
      *(undefined8 *)(puVar20 + -0x1140) = 0x123115;
      iVar10 = CUnpacker::GetInt(*(CUnpacker **)(puVar20 + -0x1130));
      *(int *)(puVar20 + -0xf74) = iVar10;
      *(undefined8 *)(puVar20 + -0x1140) = 0x123129;
      iVar10 = CUnpacker::GetInt(*(CUnpacker **)(puVar20 + -0x1130));
      *(int *)(puVar20 + -0xf78) = iVar10;
      *(undefined8 *)(puVar20 + -0x1140) = 0x12313d;
      iVar10 = CUnpacker::GetInt(*(CUnpacker **)(puVar20 + -0x1130));
      *(int *)(puVar20 + -0xf7c) = iVar10;
      *(undefined8 *)(puVar20 + -0x1140) = 0x123151;
      iVar10 = CUnpacker::GetInt(*(CUnpacker **)(puVar20 + -0x1130));
      *(int *)(puVar20 + -0xf80) = iVar10;
      *(undefined8 *)(puVar20 + -0x1140) = 0x123165;
      bVar9 = CUnpacker::Error((CUnpacker *)(puVar20 + -0xf48));
      if (!bVar9) {
        *(undefined8 *)(puVar20 + -0x1140) = 0x123182;
        puVar12 = CUnpacker::GetRaw((CUnpacker *)(puVar20 + -0xf48),0x20);
        *(uchar **)(puVar20 + -0xf88) = puVar12;
        *(undefined8 *)(puVar20 + -0xf90) = 0;
        plVar3 = *(long **)(*(long *)(puVar20 + -0x1060) + 0x80);
        pcVar4 = *(code **)(*plVar3 + 0x18);
        *(undefined8 *)(puVar20 + -0x1140) = 0x1231cd;
        uVar13 = (*pcVar4)(plVar3,*(undefined8 *)(puVar20 + -0xf70),
                           *(undefined8 *)(puVar20 + -0xf88),*(undefined4 *)(puVar20 + -0xf74),
                           *(undefined4 *)(puVar20 + -0xf78));
        if ((uVar13 & 1) == 0) {
          *(char **)(puVar20 + -0xf90) = "invalid standard map";
        }
        *(undefined4 *)(puVar20 + -0xf94) = 0;
        while (*(char *)(*(long *)(puVar20 + -0xf70) + (long)*(int *)(puVar20 + -0xf94)) != '\0') {
          if ((*(char *)(*(long *)(puVar20 + -0xf70) + (long)*(int *)(puVar20 + -0xf94)) == '/') ||
             (*(char *)(*(long *)(puVar20 + -0xf70) + (long)*(int *)(puVar20 + -0xf94)) == '\\')) {
            *(char **)(puVar20 + -0xf90) = "strange character in map name";
          }
          *(int *)(puVar20 + -0xf94) = *(int *)(puVar20 + -0xf94) + 1;
        }
        if (*(int *)(puVar20 + -0xf78) < 1) {
          *(char **)(puVar20 + -0xf90) = "invalid map size";
        }
        if (*(long *)(puVar20 + -0xf90) == 0) {
          *(undefined8 *)(puVar20 + -0x1140) = 0x1232b9;
          pcVar11 = LoadMapSearch(*(CClient **)(puVar20 + -0x10f0),*(char **)(puVar20 + -0x10f8),
                                  *(SHA256_DIGEST **)(puVar20 + -0x1100),*(int *)(puVar20 + -0x1104)
                                 );
          *(char **)(puVar20 + -0xf90) = pcVar11;
          if (*(long *)(puVar20 + -0xf90) == 0) {
            plVar3 = *(long **)(*(long *)(puVar20 + -0x1060) + 0x98);
            pcVar4 = *(code **)(*plVar3 + 200);
            *(undefined8 *)(puVar20 + -0x1140) = 0x1232fa;
            (*pcVar4)(plVar3,1,"client/network","loading done",0);
            *(undefined8 *)(puVar20 + -0x1140) = 0x123307;
            SendReady(*(CClient **)(puVar20 + -0x1130));
          }
          else {
            if (*(long *)(*(long *)(puVar20 + -0x1060) + 0x59c70) != 0) {
              *(undefined8 *)(puVar20 + -0x1140) = 0x123332;
              io_close(*(IOHANDLE *)(puVar20 + -0x1140));
              *(undefined8 *)(puVar20 + -0x1140) = 0x12333f;
              pIVar14 = Storage(*(CClient **)(puVar20 + -0x1060));
              p_Var5 = (pIVar14->super_IInterface)._vptr_IInterface[9];
              *(undefined8 *)(puVar20 + -0x1140) = 0x123359;
              (*p_Var5)(pIVar14,*(long *)(puVar20 + -0x1060) + 0x5986c,0);
            }
            *(undefined8 *)(puVar20 + -0x1140) = 0x12338c;
            FormatMapDownloadFilename
                      (*(char **)(puVar20 + -0x10f8),*(SHA256_DIGEST **)(puVar20 + -0x1100),
                       *(int *)(puVar20 + -0x1104),(bool)puVar20[-0x1105],
                       *(char **)(puVar20 + -0x1110),*(int *)(puVar20 + -0x1114));
            *(undefined8 *)(puVar20 + -0x1140) = 0x1233c2;
            FormatMapDownloadFilename
                      (*(char **)(puVar20 + -0x10f8),*(SHA256_DIGEST **)(puVar20 + -0x1100),
                       *(int *)(puVar20 + -0x1104),(bool)puVar20[-0x1105],
                       *(char **)(puVar20 + -0x1110),*(int *)(puVar20 + -0x1114));
            *(undefined8 *)(puVar20 + -0x1140) = 0x1233ec;
            str_format(puVar20 + 0x22ef8,0x100,"starting to download map to \'%s\'",
                       *(long *)(puVar20 + -0x1060) + 0x5986c);
            plVar3 = *(long **)(*(long *)(puVar20 + -0x1060) + 0x98);
            pcVar4 = *(code **)(*plVar3 + 200);
            *(undefined8 *)(puVar20 + -0x1140) = 0x12341b;
            (*pcVar4)(plVar3,1,"client/network",puVar20 + 0x22ef8,0);
            *(undefined8 *)(puVar20 + -0x1140) = 0x12343c;
            str_copy(*(char **)(puVar20 + -0x1130),*(char **)(puVar20 + -0x1138),
                     *(int *)(puVar20 + -0x113c));
            *(undefined8 *)(puVar20 + -0x1140) = 0x123449;
            pIVar14 = Storage(*(CClient **)(puVar20 + -0x1060));
            pp_Var6 = (pIVar14->super_IInterface)._vptr_IInterface;
            *(undefined8 *)(puVar20 + -0x1138) = 0;
            *(undefined8 *)(puVar20 + -0x1130) = 0;
            p_Var5 = pp_Var6[4];
            *(undefined8 *)(puVar20 + -0x1140) = 0x123482;
            iVar10 = (*p_Var5)(pIVar14,*(long *)(puVar20 + -0x1060) + 0x5986c,2,0,0);
            lVar19 = *(long *)(puVar20 + -0x1060);
            *(ulong *)(lVar19 + 0x59c70) = CONCAT44(extraout_var,iVar10);
            *(undefined4 *)(lVar19 + 0x59c78) = 0;
            *(undefined4 *)(lVar19 + 0x59c7c) = *(undefined4 *)(puVar20 + -0xf7c);
            *(undefined4 *)(lVar19 + 0x59c80) = *(undefined4 *)(puVar20 + -0xf80);
            if (*(long *)(puVar20 + -0xf88) == 0) {
              *(SHA256_DIGEST **)(puVar20 + -0x1068) = &SHA256_ZEROED;
            }
            else {
              *(undefined8 *)(puVar20 + -0x1068) = *(undefined8 *)(puVar20 + -0xf88);
            }
            lVar19 = *(long *)(puVar20 + -0x1060);
            puVar7 = *(undefined8 **)(puVar20 + -0x1068);
            *(undefined8 *)(lVar19 + 0x59c84) = *puVar7;
            *(undefined8 *)(lVar19 + 0x59c8c) = puVar7[1];
            *(undefined8 *)(lVar19 + 0x59c94) = puVar7[2];
            *(undefined8 *)(lVar19 + 0x59c9c) = puVar7[3];
            *(bool *)(lVar19 + 0x59ca4) = *(long *)(puVar20 + -0xf88) != 0;
            *(undefined4 *)(lVar19 + 0x59ca8) = *(undefined4 *)(puVar20 + -0xf74);
            *(undefined4 *)(lVar19 + 0x59cb0) = *(undefined4 *)(puVar20 + -0xf78);
            *(undefined4 *)(lVar19 + 0x59cac) = 0;
            *(undefined8 *)(puVar20 + -0x1140) = 0x123571;
            CMsgPacker::CMsgPacker
                      (*(CMsgPacker **)(puVar20 + -0x1130),*(int *)(puVar20 + -0x1134),
                       (bool)puVar20[-0x1135]);
            pcVar4 = *(code **)(**(long **)(puVar20 + -0x1060) + 0x120);
            *(undefined8 *)(puVar20 + -0x1140) = 0x12358f;
            (*pcVar4)(*(long **)(puVar20 + -0x1060),puVar20 + 0x226e0,3);
            *(undefined8 *)(puVar20 + -0x1140) = 0x12359c;
            pCVar15 = Config(*(CClient **)(puVar20 + -0x1060));
            if (pCVar15->m_Debug != 0) {
              plVar3 = *(long **)(*(long *)(puVar20 + -0x1060) + 0x98);
              pcVar4 = *(code **)(*plVar3 + 200);
              *(undefined8 *)(puVar20 + -0x1140) = 0x1235d3;
              (*pcVar4)(plVar3,2,"client/network","requested first chunk package",0);
            }
          }
        }
        else {
          *(undefined8 *)(puVar20 + -0x1140) = 0x123290;
          DisconnectWithReason(*(CClient **)(puVar20 + -0x1118),*(char **)(puVar20 + -0x1120));
        }
      }
    }
  }
LAB_00124afc:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(puVar20 + 0x22ff8)) {
    *(undefined **)(puVar20 + -0x1140) = &UNK_00124b1f;
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CClient::ProcessServerPacket(CNetChunk *pPacket)
{
	CUnpacker Unpacker;
	Unpacker.Reset(pPacket->m_pData, pPacket->m_DataSize);

	// unpack msgid and system flag
	int Msg = Unpacker.GetInt();
	int Sys = Msg&1;
	Msg >>= 1;

	if(Unpacker.Error())
		return;

	if(Sys)
	{
		// system message
		if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_MAP_CHANGE)
		{
			const char *pMap = Unpacker.GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
			int MapCrc = Unpacker.GetInt();
			int MapSize = Unpacker.GetInt();
			int MapChunkNum = Unpacker.GetInt();
			int MapChunkSize = Unpacker.GetInt();
			if(Unpacker.Error())
				return;
			const SHA256_DIGEST *pMapSha256 = (const SHA256_DIGEST *)Unpacker.GetRaw(sizeof(*pMapSha256));
			const char *pError = 0;

			// check for valid standard map
			if(!m_pMapChecker->IsMapValid(pMap, pMapSha256, MapCrc, MapSize))
				pError = "invalid standard map";

			// protect the player from nasty map names
			for(int i = 0; pMap[i]; i++)
			{
				if(pMap[i] == '/' || pMap[i] == '\\')
					pError = "strange character in map name";
			}

			if(MapSize <= 0)
				pError = "invalid map size";

			if(pError)
				DisconnectWithReason(pError);
			else
			{
				pError = LoadMapSearch(pMap, pMapSha256, MapCrc);

				if(!pError)
				{
					m_pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client/network", "loading done");
					SendReady();
				}
				else
				{
					if(m_MapdownloadFileTemp)
					{
						io_close(m_MapdownloadFileTemp);
						Storage()->RemoveFile(m_aMapdownloadFilenameTemp, IStorage::TYPE_SAVE);
					}

					// start map download
					FormatMapDownloadFilename(pMap, pMapSha256, MapCrc, false, m_aMapdownloadFilename, sizeof(m_aMapdownloadFilename));
					FormatMapDownloadFilename(pMap, pMapSha256, MapCrc, true, m_aMapdownloadFilenameTemp, sizeof(m_aMapdownloadFilenameTemp));

					char aBuf[256];
					str_format(aBuf, sizeof(aBuf), "starting to download map to '%s'", m_aMapdownloadFilenameTemp);
					m_pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client/network", aBuf);

					str_copy(m_aMapdownloadName, pMap, sizeof(m_aMapdownloadName));
					m_MapdownloadFileTemp = Storage()->OpenFile(m_aMapdownloadFilenameTemp, IOFLAG_WRITE, IStorage::TYPE_SAVE);
					m_MapdownloadChunk = 0;
					m_MapdownloadChunkNum = MapChunkNum;
					m_MapDownloadChunkSize = MapChunkSize;
					m_MapdownloadSha256 = pMapSha256 ? *pMapSha256 : SHA256_ZEROED;
					m_MapdownloadSha256Present = pMapSha256;
					m_MapdownloadCrc = MapCrc;
					m_MapdownloadTotalsize = MapSize;
					m_MapdownloadAmount = 0;

					// request first chunk package of map data
					CMsgPacker Msg(NETMSG_REQUEST_MAP_DATA, true);
					SendMsg(&Msg, MSGFLAG_VITAL|MSGFLAG_FLUSH);

					if(Config()->m_Debug)
						m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client/network", "requested first chunk package");
				}
			}
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_MAP_DATA)
		{
			if(!m_MapdownloadFileTemp)
				return;

			int Size = minimum(m_MapDownloadChunkSize, m_MapdownloadTotalsize-m_MapdownloadAmount);
			const unsigned char *pData = Unpacker.GetRaw(Size);
			if(Unpacker.Error())
				return;

			io_write(m_MapdownloadFileTemp, pData, Size);
			++m_MapdownloadChunk;
			m_MapdownloadAmount += Size;

			if(m_MapdownloadAmount == m_MapdownloadTotalsize)
			{
				// map download complete
				m_pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client/network", "download complete, loading map");

				if(m_MapdownloadFileTemp)
					io_close(m_MapdownloadFileTemp);
				m_MapdownloadFileTemp = 0;
				m_MapdownloadAmount = 0;
				m_MapdownloadTotalsize = -1;

				Storage()->RemoveFile(m_aMapdownloadFilename, IStorage::TYPE_SAVE);
				Storage()->RenameFile(m_aMapdownloadFilenameTemp, m_aMapdownloadFilename, IStorage::TYPE_SAVE);

				// load map
				const char *pError = LoadMap(m_aMapdownloadName, m_aMapdownloadFilename, m_MapdownloadSha256Present ? &m_MapdownloadSha256 : 0, m_MapdownloadCrc);
				if(!pError)
				{
					m_pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client/network", "loading done");
					SendReady();
				}
				else
					DisconnectWithReason(pError);
			}
			else if(m_MapdownloadChunk%m_MapdownloadChunkNum == 0)
			{
				// request next chunk package of map data
				CMsgPacker Msg(NETMSG_REQUEST_MAP_DATA, true);
				SendMsg(&Msg, MSGFLAG_VITAL|MSGFLAG_FLUSH);

				if(Config()->m_Debug)
					m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client/network", "requested next chunk package");
			}
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_SERVERINFO)
		{
			CServerInfo Info = {0};
			net_addr_str(&pPacket->m_Address, Info.m_aAddress, sizeof(Info.m_aAddress), true);
			if(!UnpackServerInfo(&Unpacker, &Info, 0) && !Unpacker.Error())
			{
				SortClients(&Info);
				mem_copy(&m_CurrentServerInfo, &Info, sizeof(m_CurrentServerInfo));
				m_CurrentServerInfo.m_NetAddr = m_ServerAddress;
			}
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_CON_READY)
		{
			GameClient()->OnConnected();
		}
		else if(Msg == NETMSG_PING)
		{
			CMsgPacker Msg(NETMSG_PING_REPLY, true);
			SendMsg(&Msg, 0);
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_RCON_CMD_ADD)
		{
			const char *pName = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			const char *pHelp = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			const char *pParams = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			if(Unpacker.Error() == 0)
				m_pConsole->RegisterTemp(pName, pParams, CFGFLAG_SERVER, pHelp);
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_RCON_CMD_REM)
		{
			const char *pName = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			if(Unpacker.Error() == 0)
				m_pConsole->DeregisterTemp(pName);
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_MAPLIST_ENTRY_ADD)
		{
			const char *pName = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			if(Unpacker.Error() == 0)
				m_pConsole->RegisterTempMap(pName);
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_MAPLIST_ENTRY_REM)
		{
			const char *pName = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			if(Unpacker.Error() == 0)
				m_pConsole->DeregisterTempMap(pName);
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_RCON_AUTH_ON)
		{
			m_RconAuthed = 1;
			m_UseTempRconCommands = 1;
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_RCON_AUTH_OFF)
		{
			m_RconAuthed = 0;
			if(m_UseTempRconCommands)
				m_pConsole->DeregisterTempAll();
			m_UseTempRconCommands = 0;
			m_pConsole->DeregisterTempMapAll();
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_RCON_LINE)
		{
			const char *pLine = Unpacker.GetString();
			if(Unpacker.Error() == 0)
				GameClient()->OnRconLine(pLine);
		}
		else if(Msg == NETMSG_PING_REPLY)
		{
			char aBuf[256];
			str_format(aBuf, sizeof(aBuf), "latency %.2f", (time_get() - m_PingStartTime)*1000 / (float)time_freq());
			m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client/network", aBuf);
		}
		else if(Msg == NETMSG_INPUTTIMING)
		{
			int InputPredTick = Unpacker.GetInt();
			int TimeLeft = Unpacker.GetInt();

			// adjust our prediction time
			int64 Target = 0;
			for(int k = 0; k < 200; k++)
			{
				if(m_aInputs[k].m_Tick == InputPredTick)
				{
					Target = m_aInputs[k].m_PredictedTime + (time_get() - m_aInputs[k].m_Time);
					Target = Target - (int64)(((TimeLeft-PREDICTION_MARGIN)/1000.0f)*time_freq());
					break;
				}
			}

			if(Target)
				m_PredictedTime.Update(&m_InputtimeMarginGraph, Target, TimeLeft, 1);
		}
		else if(Msg == NETMSG_SNAP || Msg == NETMSG_SNAPSINGLE || Msg == NETMSG_SNAPEMPTY)
		{
			int NumParts = 1;
			int Part = 0;
			int GameTick = Unpacker.GetInt();
			int DeltaTick = GameTick-Unpacker.GetInt();
			int PartSize = 0;
			int Crc = 0;
			int CompleteSize = 0;
			const char *pData = 0;

			// we are not allowed to process snapshot yet
			if(State() < IClient::STATE_LOADING)
				return;

			if(Msg == NETMSG_SNAP)
			{
				NumParts = Unpacker.GetInt();
				Part = Unpacker.GetInt();
			}

			if(Msg != NETMSG_SNAPEMPTY)
			{
				Crc = Unpacker.GetInt();
				PartSize = Unpacker.GetInt();
			}

			pData = (const char *)Unpacker.GetRaw(PartSize);

			if(Unpacker.Error() || NumParts < 1 || NumParts > CSnapshot::MAX_PARTS || Part < 0 || Part >= NumParts || PartSize < 0 || PartSize > MAX_SNAPSHOT_PACKSIZE)
				return;

			if(GameTick >= m_CurrentRecvTick)
			{
				if(GameTick != m_CurrentRecvTick)
				{
					m_SnapshotParts = 0;
					m_CurrentRecvTick = GameTick;
				}

				// TODO: clean this up abit
				mem_copy((char*)m_aSnapshotIncomingData + Part*MAX_SNAPSHOT_PACKSIZE, pData, PartSize);
				m_SnapshotParts |= 1<<Part;

				if(m_SnapshotParts == (unsigned)((1<<NumParts)-1))
				{
					static CSnapshot Emptysnap;
					CSnapshot *pDeltaShot = &Emptysnap;
					int PurgeTick;
					int DeltaSize;
					unsigned char aTmpBuffer2[CSnapshot::MAX_SIZE];
					unsigned char aTmpBuffer3[CSnapshot::MAX_SIZE];
					CSnapshot *pTmpBuffer3 = (CSnapshot*)aTmpBuffer3;	// Fix compiler warning for strict-aliasing
					int SnapSize;

					CompleteSize = (NumParts-1) * MAX_SNAPSHOT_PACKSIZE + PartSize;

					// reset snapshoting
					m_SnapshotParts = 0;

					// find snapshot that we should use as delta
					Emptysnap.Clear();

					// find delta
					if(DeltaTick >= 0)
					{
						int DeltashotSize = m_SnapshotStorage.Get(DeltaTick, 0, &pDeltaShot, 0);

						if(DeltashotSize < 0)
						{
							// couldn't find the delta snapshots that the server used
							// to compress this snapshot. force the server to resync
							if(Config()->m_Debug)
							{
								char aBuf[256];
								str_format(aBuf, sizeof(aBuf), "error, couldn't find the delta snapshot");
								m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client", aBuf);
							}

							// ack snapshot
							// TODO: combine this with the input message
							m_AckGameTick = -1;
							return;
						}
					}

					// decompress snapshot
					const void *pDeltaData = m_SnapshotDelta.EmptyDelta();
					DeltaSize = sizeof(int)*3;

					if(CompleteSize)
					{
						int IntSize = CVariableInt::Decompress(m_aSnapshotIncomingData, CompleteSize, aTmpBuffer2, sizeof(aTmpBuffer2));

						if(IntSize < 0) // failure during decompression, bail
							return;

						pDeltaData = aTmpBuffer2;
						DeltaSize = IntSize;
					}

					// unpack delta
					SnapSize = m_SnapshotDelta.UnpackDelta(pDeltaShot, pTmpBuffer3, pDeltaData, DeltaSize);
					if(SnapSize < 0)
					{
						char aBuf[64];
						str_format(aBuf, sizeof(aBuf), "delta unpack failed! (%d)", SnapSize);
						m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client", aBuf);
						return;
					}

					if(Msg != NETMSG_SNAPEMPTY && pTmpBuffer3->Crc() != Crc)
					{
						if(Config()->m_Debug)
						{
							char aBuf[256];
							str_format(aBuf, sizeof(aBuf), "snapshot crc error #%d - tick=%d wantedcrc=%d gotcrc=%d compressed_size=%d delta_tick=%d",
								m_SnapCrcErrors, GameTick, Crc, pTmpBuffer3->Crc(), CompleteSize, DeltaTick);
							m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client", aBuf);
						}

						m_SnapCrcErrors++;
						if(m_SnapCrcErrors > 10)
						{
							// to many errors, send reset
							m_AckGameTick = -1;
							SendInput();
							m_SnapCrcErrors = 0;
						}
						return;
					}
					else
					{
						if(m_SnapCrcErrors)
							m_SnapCrcErrors--;
					}

					// purge old snapshots
					PurgeTick = DeltaTick;
					if(m_aSnapshots[SNAP_PREV] && m_aSnapshots[SNAP_PREV]->m_Tick < PurgeTick)
						PurgeTick = m_aSnapshots[SNAP_PREV]->m_Tick;
					if(m_aSnapshots[SNAP_CURRENT] && m_aSnapshots[SNAP_CURRENT]->m_Tick < PurgeTick)
						PurgeTick = m_aSnapshots[SNAP_CURRENT]->m_Tick;
					m_SnapshotStorage.PurgeUntil(PurgeTick);

					// add new
					m_SnapshotStorage.Add(GameTick, time_get(), SnapSize, pTmpBuffer3, 1);

					// add snapshot to demo
					if(m_DemoRecorder.IsRecording())
					{
						// build up snapshot and add local messages
						m_DemoRecSnapshotBuilder.Init(pTmpBuffer3);
						GameClient()->OnDemoRecSnap();
						SnapSize = m_DemoRecSnapshotBuilder.Finish(pTmpBuffer3);

						// write snapshot
						m_DemoRecorder.RecordSnapshot(GameTick, pTmpBuffer3, SnapSize);
					}

					// apply snapshot, cycle pointers
					m_ReceivedSnapshots++;

					m_CurrentRecvTick = GameTick;

					// we got two snapshots until we see us self as connected
					if(m_ReceivedSnapshots == 2)
					{
						// start at 200ms and work from there
						m_PredictedTime.Init(GameTick*time_freq()/50);
						m_PredictedTime.SetAdjustSpeed(1, 1000.0f);
						m_GameTime.Init((GameTick-1)*time_freq()/50);
						m_aSnapshots[SNAP_PREV] = m_SnapshotStorage.m_pFirst;
						m_aSnapshots[SNAP_CURRENT] = m_SnapshotStorage.m_pLast;
						SetState(IClient::STATE_ONLINE);
					}

					// adjust game time
					if(m_ReceivedSnapshots > 2)
					{
						int64 Now = m_GameTime.Get(time_get());
						int64 TickStart = GameTick*time_freq()/50;
						int64 TimeLeft = (TickStart-Now)*1000 / time_freq();
						m_GameTime.Update(&m_GametimeMarginGraph, (GameTick-1)*time_freq()/50, TimeLeft, 0);
					}

					// ack snapshot
					m_AckGameTick = GameTick;
				}
			}
		}
	}
	else
	{
		if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0)
		{
			// game message
			GameClient()->OnMessage(Msg, &Unpacker);

			if(m_RecordGameMessage && m_DemoRecorder.IsRecording())
				m_DemoRecorder.RecordMessage(pPacket->m_pData, pPacket->m_DataSize);
		}
	}
}